

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_avx2_256_64.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_table_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  __m256i vH_00;
  undefined1 auVar6 [32];
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  __m256i b_11;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i a_10;
  __m256i a_11;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [24];
  int iVar25;
  long lVar26;
  ulong uVar27;
  __m256i *palVar28;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  long lVar37;
  long lVar38;
  undefined1 auVar36 [32];
  long lVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int in_stack_00000008;
  __m256i vH_1;
  int32_t temp;
  int32_t column_len;
  int64_t *t;
  __m256i vCompare;
  __m256i vFt;
  __m256i vW;
  __m256i *pvW;
  __m256i vHp;
  __m256i vH;
  __m256i vF;
  __m256i vHt;
  __m256i vE;
  __m256i vGapper;
  int64_t tmp_1;
  int64_t tmp;
  __m256i_64_t e;
  __m256i_64_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m256i vSegLenXgap;
  __m256i vNegInfFront;
  __m256i vPosMask;
  __m256i vMaxH;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int64_t score;
  __m256i vZero;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  __m256i *pvGapper;
  __m256i *pvH;
  __m256i *pvHt;
  int64_t *boundary;
  __m256i *pvE;
  __m256i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  int32_t in_stack_fffffffffffff1e8;
  int32_t in_stack_fffffffffffff1ec;
  long in_stack_fffffffffffff1f0;
  undefined4 in_stack_fffffffffffff1f8;
  int in_stack_fffffffffffff1fc;
  long in_stack_fffffffffffff200;
  ulong in_stack_fffffffffffff208;
  undefined4 in_stack_fffffffffffff210;
  int in_stack_fffffffffffff214;
  int *in_stack_fffffffffffff220;
  ulong uStack_dd8;
  ulong uStack_dd0;
  undefined8 in_stack_fffffffffffff238;
  undefined1 in_stack_fffffffffffff240 [16];
  undefined4 in_stack_fffffffffffff250;
  undefined4 in_stack_fffffffffffff254;
  undefined8 in_stack_fffffffffffff258;
  longlong *plVar65;
  undefined8 in_stack_fffffffffffff260;
  undefined8 in_stack_fffffffffffff268;
  longlong in_stack_fffffffffffff270;
  ulong uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined1 local_d20 [32];
  ulong local_d00;
  ulong uStack_cf8;
  ulong uStack_cf0;
  ulong uStack_ce8;
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  longlong local_ca0;
  longlong lStack_c98;
  longlong lStack_c90;
  longlong lStack_c88;
  undefined1 local_c80 [32];
  longlong local_c40 [4];
  ulong local_c20 [6];
  int local_bf0;
  int local_bec;
  parasail_result_t *local_be8;
  undefined1 local_be0 [32];
  ulong local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  long local_ba0;
  long lStack_b98;
  long lStack_b90;
  long lStack_b88;
  undefined1 local_b80 [32];
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  ulong local_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  ulong local_a90;
  ulong local_a88;
  undefined1 local_a80 [16];
  undefined1 auStack_a70 [16];
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  __m256i *local_a28;
  longlong *local_a20;
  __m256i *local_a18;
  int64_t *local_a10;
  __m256i *local_a08;
  long local_a00;
  int local_9f8;
  int local_9f4;
  int local_9f0;
  int local_9ec;
  long local_9e8;
  int local_9e0;
  int local_9dc;
  int local_9d8;
  int local_9d4;
  int local_9d0;
  int local_9cc;
  int local_9c8;
  int local_9c4;
  int local_9c0;
  int local_9bc;
  long local_9b8;
  parasail_result_t *local_9a8;
  ulong local_9a0;
  ulong local_998;
  ulong local_990;
  ulong local_988;
  ulong local_980;
  ulong local_978;
  ulong local_970;
  ulong local_968;
  undefined1 local_960 [32];
  long local_940;
  long lStack_938;
  long lStack_930;
  long lStack_928;
  long local_920;
  long lStack_918;
  long lStack_910;
  long lStack_908;
  undefined1 local_900 [16];
  undefined1 auStack_8f0 [16];
  ulong local_8e0;
  ulong local_8d8;
  ulong local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [32];
  ulong local_8a0;
  ulong local_898;
  ulong local_890;
  ulong local_888;
  undefined1 local_880 [16];
  undefined1 auStack_870 [16];
  ulong local_860;
  ulong local_858;
  ulong local_850;
  ulong local_848;
  undefined1 local_840 [16];
  undefined1 auStack_830 [16];
  ulong local_820;
  ulong local_818;
  ulong local_810;
  ulong local_808;
  undefined1 local_800 [16];
  undefined1 auStack_7f0 [16];
  ulong local_7e0;
  ulong local_7d8;
  ulong local_7d0;
  ulong local_7c8;
  undefined1 local_7c0 [16];
  undefined1 auStack_7b0 [16];
  ulong local_7a0;
  ulong local_798;
  ulong local_790;
  ulong local_788;
  undefined1 local_780 [16];
  undefined1 auStack_770 [16];
  ulong local_760;
  ulong local_758;
  ulong local_750;
  ulong local_748;
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  ulong local_720;
  ulong local_718;
  ulong local_710;
  ulong local_708;
  undefined1 local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined8 local_6e0;
  undefined8 local_6d8;
  undefined8 local_6d0;
  undefined8 local_6c8;
  ulong local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  longlong local_640;
  longlong lStack_638;
  longlong lStack_630;
  longlong lStack_628;
  ulong local_620;
  ulong uStack_618;
  ulong uStack_610;
  ulong uStack_608;
  longlong local_600;
  longlong lStack_5f8;
  longlong lStack_5f0;
  longlong lStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined1 local_580 [32];
  ulong local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  ulong local_540;
  ulong uStack_538;
  ulong uStack_530;
  ulong uStack_528;
  longlong *local_508;
  longlong local_500;
  longlong lStack_4f8;
  longlong lStack_4f0;
  longlong lStack_4e8;
  __m256i *local_4c8;
  longlong local_4c0;
  longlong lStack_4b8;
  longlong lStack_4b0;
  longlong lStack_4a8;
  __m256i *local_488;
  longlong local_480;
  longlong lStack_478;
  longlong lStack_470;
  longlong lStack_468;
  __m256i *local_448;
  __m256i *local_408;
  longlong *local_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  ulong local_3a0;
  ulong uStack_398;
  ulong uStack_390;
  ulong uStack_388;
  undefined1 local_380 [16];
  undefined1 auStack_370 [16];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  long local_320;
  long lStack_318;
  long lStack_310;
  long lStack_308;
  undefined1 local_300 [16];
  undefined1 auStack_2f0 [16];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  longlong lStack_2c8;
  longlong local_2c0;
  longlong lStack_2b8;
  longlong lStack_2b0;
  longlong lStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  longlong local_260;
  longlong lStack_258;
  longlong lStack_250;
  longlong lStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  longlong *local_1f8;
  longlong *local_1f0;
  __m256i *local_1e8;
  undefined1 (*local_1e0) [32];
  __m256i *local_1d8;
  longlong *local_1d0;
  longlong *local_1c8;
  undefined1 local_1c0 [32];
  long local_1a0;
  long lStack_198;
  long lStack_190;
  long lStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  long local_e0;
  long lStack_d8;
  long lStack_d0;
  long lStack_c8;
  undefined1 local_c0 [32];
  undefined8 local_a0;
  undefined8 uStack_98;
  longlong lStack_90;
  ulong uStack_88;
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  local_9cc = 0;
  local_9d0 = 0;
  local_9d4 = 0;
  local_9d8 = 0;
  local_9dc = 0;
  local_9e0 = 0;
  local_9e8 = 0;
  local_9ec = 0;
  local_9f0 = 0;
  local_9f4 = 0;
  local_9f8 = 0;
  local_a00 = 0;
  local_a08 = (__m256i *)0x0;
  local_a10 = (int64_t *)0x0;
  local_a18 = (__m256i *)0x0;
  local_a20 = (longlong *)0x0;
  local_a28 = (__m256i *)0x0;
  local_a88 = 0;
  local_a90 = 0;
  local_ac8 = 0;
  local_be8 = (parasail_result_t *)0x0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_avx2_256_64","profile")
    ;
    local_9a8 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x60) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_avx2_256_64",
            "profile->profile64.score");
    local_9a8 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_avx2_256_64",
            "profile->matrix");
    local_9a8 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_scan_profile_avx2_256_64",
            "profile->s1Len");
    local_9a8 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_avx2_256_64","s2");
    local_9a8 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_scan_profile_avx2_256_64",
            "s2Len");
    local_9a8 = (parasail_result_t *)0x0;
  }
  else if (in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_scan_profile_avx2_256_64",
            "open");
    local_9a8 = (parasail_result_t *)0x0;
  }
  else if (in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_scan_profile_avx2_256_64","gap"
           );
    local_9a8 = (parasail_result_t *)0x0;
  }
  else {
    local_9cc = 0;
    local_9d0 = 0;
    local_9d4 = 0;
    local_9e0 = *(int *)(in_RDI + 8);
    local_9d8 = local_9e0 + -1;
    local_9dc = in_EDX + -1;
    local_9e8 = *(long *)(in_RDI + 0x10);
    local_9ec = 4;
    local_9f0 = (local_9e0 + 3) / 4;
    local_9f4 = (local_9e0 + -1) % local_9f0;
    local_9f8 = ~((local_9e0 + -1) / local_9f0) + 4;
    local_a00 = *(long *)(in_RDI + 0x60);
    local_968 = (ulong)in_ECX;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_968;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_968;
    local_900 = vpunpcklqdq_avx(auVar29,auVar40);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = local_968;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_968;
    auStack_8f0 = vpunpcklqdq_avx(auVar41,auVar49);
    local_a60 = local_900._0_8_;
    uStack_a58 = local_900._8_8_;
    uStack_a50 = auStack_8f0._0_8_;
    uStack_a48 = auStack_8f0._8_8_;
    local_970 = (ulong)in_R8D;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_970;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_970;
    auVar29 = vpunpcklqdq_avx(auVar30,auVar42);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_970;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_970;
    auVar30 = vpunpcklqdq_avx(auVar31,auVar50);
    local_8c0._0_16_ = ZEXT116(0) * auVar29 + ZEXT116(1) * auVar30;
    local_8c0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar29;
    if (-in_ECX < *(int *)(local_9e8 + 0x20)) {
      lVar26 = (long)in_ECX;
    }
    else {
      lVar26 = -(long)*(int *)(local_9e8 + 0x20);
    }
    local_bc0 = lVar26 + 0x8000000000000001;
    local_a90 = 0x7ffffffffffffffe - (long)*(int *)(local_9e8 + 0x1c);
    local_960._8_8_ = SUB328(ZEXT832(0),4);
    local_ac0 = 0;
    uStack_ab8 = local_960._8_8_;
    uStack_ab0 = 0;
    uStack_aa8 = 0;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_bc0;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_bc0;
    local_880 = vpunpcklqdq_avx(auVar32,auVar43);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_bc0;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_bc0;
    auStack_870 = vpunpcklqdq_avx(auVar44,auVar51);
    local_b00 = local_880._0_8_;
    uStack_af8 = local_880._8_8_;
    uStack_af0 = auStack_870._0_8_;
    uStack_ae8 = auStack_870._8_8_;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_a90;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = local_a90;
    local_840 = vpunpcklqdq_avx(auVar33,auVar45);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_a90;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_a90;
    auStack_830 = vpunpcklqdq_avx(auVar46,auVar52);
    local_b20 = local_840._0_8_;
    uStack_b18 = local_840._8_8_;
    uStack_b10 = auStack_830._0_8_;
    uStack_b08 = auStack_830._8_8_;
    local_b40 = local_840._0_8_;
    uStack_b38 = local_840._8_8_;
    uStack_b30 = auStack_830._0_8_;
    uStack_b28 = auStack_830._8_8_;
    local_b60 = local_880._0_8_;
    uStack_b58 = local_880._8_8_;
    uStack_b50 = auStack_870._0_8_;
    uStack_b48 = auStack_870._8_8_;
    local_b80._16_8_ = auStack_870._0_8_;
    local_b80._0_16_ = local_880;
    local_b80._24_8_ = auStack_870._8_8_;
    local_988 = (ulong)local_9f8;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_988;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_988;
    local_800 = vpunpcklqdq_avx(auVar34,auVar47);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_988;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_988;
    auStack_7f0 = vpunpcklqdq_avx(auVar48,auVar53);
    local_6c8 = 0;
    local_6d0 = 1;
    local_6d8 = 2;
    local_6e0 = 3;
    local_700 = vpunpcklqdq_avx(ZEXT816(3),ZEXT816(2));
    auStack_6f0 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(0));
    local_920 = local_800._0_8_;
    lStack_918 = local_800._8_8_;
    lStack_910 = auStack_7f0._0_8_;
    lStack_908 = auStack_7f0._8_8_;
    local_940 = local_700._0_8_;
    lStack_938 = local_700._8_8_;
    lStack_930 = auStack_6f0._0_8_;
    lStack_928 = auStack_6f0._8_8_;
    local_ba0 = -(ulong)(local_800._0_8_ == local_700._0_8_);
    lStack_b98 = -(ulong)(local_800._8_8_ == local_700._8_8_);
    lStack_b90 = -(ulong)(auStack_7f0._0_8_ == auStack_6f0._0_8_);
    lStack_b88 = -(ulong)(auStack_7f0._8_8_ == auStack_6f0._8_8_);
    uStack_bb8 = local_960._8_8_;
    uStack_bb0 = 0;
    uStack_ba8 = 0;
    local_990 = (ulong)(-local_9f0 * in_R8D);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_990;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_990;
    local_7c0 = vpunpcklqdq_avx(auVar35,auVar54);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_990;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_990;
    auStack_7b0 = vpunpcklqdq_avx(auVar55,auVar58);
    auVar7._16_16_ = auStack_7b0;
    auVar7._0_16_ = local_7c0;
    local_998 = (ulong)(-local_9f0 * in_R8D);
    auVar56._8_8_ = 0;
    auVar56._0_8_ = local_998;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = local_998;
    local_780 = vpunpcklqdq_avx(auVar56,auVar59);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_998;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = local_998;
    auStack_770 = vpunpcklqdq_avx(auVar60,auVar61);
    auVar36._16_16_ = auStack_770;
    auVar36._0_16_ = local_780;
    local_9a0 = (ulong)(-local_9f0 * in_R8D);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_9a0;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = local_9a0;
    local_740 = vpunpcklqdq_avx(auVar57,auVar62);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = local_9a0;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_9a0;
    local_730 = vpunpcklqdq_avx(auVar63,auVar64);
    auVar36 = vperm2i128_avx2(ZEXT1632(local_740),auVar36,0x28);
    local_580 = vpalignr_avx2(auVar7,auVar36,8);
    uStack_558 = local_960._8_8_;
    uStack_550 = 0;
    uStack_548 = 0;
    local_be0 = vpaddq_avx2(ZEXT1632(CONCAT88(local_960._8_8_,local_bc0)),local_580);
    local_ac8 = local_bc0;
    local_a88 = local_bc0;
    local_9c8 = in_R9D;
    local_9c4 = in_R8D;
    local_9c0 = in_ECX;
    local_9bc = in_EDX;
    local_9b8 = in_RSI;
    local_980 = local_a90;
    local_978 = local_bc0;
    local_960 = ZEXT832(0) << 0x20;
    local_8e0 = local_968;
    local_8d8 = local_968;
    local_8d0 = local_968;
    local_8c8 = local_968;
    local_8a0 = local_970;
    local_898 = local_970;
    local_890 = local_970;
    local_888 = local_970;
    local_860 = local_bc0;
    local_858 = local_bc0;
    local_850 = local_bc0;
    local_848 = local_bc0;
    local_820 = local_a90;
    local_818 = local_a90;
    local_810 = local_a90;
    local_808 = local_a90;
    local_7e0 = local_988;
    local_7d8 = local_988;
    local_7d0 = local_988;
    local_7c8 = local_988;
    local_7a0 = local_990;
    local_798 = local_990;
    local_790 = local_990;
    local_788 = local_990;
    local_760 = local_998;
    local_758 = local_998;
    local_750 = local_998;
    local_748 = local_998;
    local_720 = local_9a0;
    local_718 = local_9a0;
    local_710 = local_9a0;
    local_708 = local_9a0;
    local_560 = local_bc0;
    local_a80 = local_8c0._0_16_;
    auStack_a70 = local_8c0._16_16_;
    local_be8 = parasail_result_new_table1(local_9f0 * 4,in_EDX);
    if (local_be8 == (parasail_result_t *)0x0) {
      local_9a8 = (parasail_result_t *)0x0;
    }
    else {
      local_be8->flag = local_be8->flag | 0x4800402;
      uVar1 = 0;
      if (local_9c8 != 0) {
        uVar1 = 8;
      }
      local_be8->flag = uVar1 | local_be8->flag;
      uVar1 = 0;
      if (in_stack_00000008 != 0) {
        uVar1 = 0x10;
      }
      local_be8->flag = uVar1 | local_be8->flag;
      uVar1 = 0;
      if (s1_end != 0) {
        uVar1 = 0x4000;
      }
      local_be8->flag = uVar1 | local_be8->flag;
      uVar1 = 0;
      if (s2_beg != 0) {
        uVar1 = 0x8000;
      }
      local_be8->flag = uVar1 | local_be8->flag;
      local_be8->flag = local_be8->flag | 0x20000;
      local_a08 = parasail_memalign___m256i(0x20,(long)local_9f0);
      local_a10 = parasail_memalign_int64_t(0x20,(long)(local_9bc + 1));
      local_a18 = parasail_memalign___m256i(0x20,(long)local_9f0);
      local_a20 = *parasail_memalign___m256i(0x20,(long)local_9f0);
      local_a28 = parasail_memalign___m256i(0x20,(long)local_9f0);
      if (local_a08 == (__m256i *)0x0) {
        local_9a8 = (parasail_result_t *)0x0;
      }
      else if (local_a10 == (int64_t *)0x0) {
        local_9a8 = (parasail_result_t *)0x0;
      }
      else if (local_a18 == (__m256i *)0x0) {
        local_9a8 = (parasail_result_t *)0x0;
      }
      else if (local_a20 == (longlong *)0x0) {
        local_9a8 = (parasail_result_t *)0x0;
      }
      else if (local_a28 == (__m256i *)0x0) {
        local_9a8 = (parasail_result_t *)0x0;
      }
      else {
        local_bec = 0;
        local_9cc = 0;
        while( true ) {
          if (local_9f0 <= local_9cc) break;
          for (local_bf0 = 0; local_bf0 < local_9ec; local_bf0 = local_bf0 + 1) {
            if (local_9c8 == 0) {
              in_stack_fffffffffffff214 =
                   -(local_9c4 * (local_bf0 * local_9f0 + local_9cc)) - local_9c0;
            }
            else {
              in_stack_fffffffffffff214 = 0;
            }
            uVar27 = (ulong)in_stack_fffffffffffff214;
            in_stack_fffffffffffff208 = uVar27;
            if ((long)uVar27 < -0x8000000000000000) {
              in_stack_fffffffffffff208 = 0x8000000000000000;
            }
            local_c20[local_bf0] = in_stack_fffffffffffff208;
            in_stack_fffffffffffff200 = uVar27 - (long)local_9c0;
            if (in_stack_fffffffffffff200 < -0x8000000000000000) {
              in_stack_fffffffffffff200 = -0x8000000000000000;
            }
            local_c40[local_bf0] = in_stack_fffffffffffff200;
          }
          local_3c8 = local_a20 + (long)local_bec * 4;
          *local_3c8 = local_c20[0];
          local_3c8[1] = local_c20[1];
          local_3c8[2] = local_c20[2];
          local_3c8[3] = local_c20[3];
          local_408 = local_a08 + local_bec;
          (*local_408)[0] = local_c40[0];
          (*local_408)[1] = local_c40[1];
          (*local_408)[2] = local_c40[2];
          (*local_408)[3] = local_c40[3];
          local_bec = local_bec + 1;
          local_9cc = local_9cc + 1;
        }
        *local_a10 = 0;
        for (local_9cc = 1; local_9cc <= local_9bc; local_9cc = local_9cc + 1) {
          if (s1_end == 0) {
            in_stack_fffffffffffff1fc = -(local_9c4 * (local_9cc + -1)) - local_9c0;
          }
          else {
            in_stack_fffffffffffff1fc = 0;
          }
          in_stack_fffffffffffff1f0 = (long)in_stack_fffffffffffff1fc;
          if (in_stack_fffffffffffff1f0 < -0x8000000000000000) {
            in_stack_fffffffffffff1f0 = -0x8000000000000000;
          }
          local_a10[local_9cc] = in_stack_fffffffffffff1f0;
        }
        local_220 = local_ac0;
        uStack_218 = uStack_ab8;
        uStack_210 = uStack_ab0;
        uStack_208 = uStack_aa8;
        local_240 = local_a60;
        uStack_238 = uStack_a58;
        uStack_230 = uStack_a50;
        uStack_228 = uStack_a48;
        auVar17._8_8_ = uStack_ab8;
        auVar17._0_8_ = local_ac0;
        auVar17._16_8_ = uStack_ab0;
        auVar17._24_8_ = uStack_aa8;
        auVar16._8_8_ = uStack_a58;
        auVar16._0_8_ = local_a60;
        auVar16._16_8_ = uStack_a50;
        auVar16._24_8_ = uStack_a48;
        local_c80 = vpsubq_avx2(auVar17,auVar16);
        local_9cc = local_9f0;
        while( true ) {
          local_9cc = local_9cc + -1;
          if (local_9cc < 0) break;
          local_448 = local_a28 + local_9cc;
          local_480 = local_c80._0_8_;
          lStack_478 = local_c80._8_8_;
          lStack_470 = local_c80._16_8_;
          lStack_468 = local_c80._24_8_;
          (*local_448)[0] = local_c80._0_8_;
          (*local_448)[1] = local_c80._8_8_;
          (*local_448)[2] = local_c80._16_8_;
          (*local_448)[3] = local_c80._24_8_;
          local_260 = local_c80._0_8_;
          lStack_258 = local_c80._8_8_;
          lStack_250 = local_c80._16_8_;
          lStack_248 = local_c80._24_8_;
          auVar15._16_8_ = auStack_a70._0_8_;
          auVar15._0_16_ = local_a80;
          auVar15._24_8_ = auStack_a70._8_8_;
          local_c80 = vpsubq_avx2(local_c80,auVar15);
          a[1] = in_stack_fffffffffffff260;
          a[0] = in_stack_fffffffffffff258;
          a[2] = in_stack_fffffffffffff268;
          a[3] = in_stack_fffffffffffff270;
          b[1] = in_stack_fffffffffffff240._0_8_;
          b[2] = in_stack_fffffffffffff240._8_8_;
          b[0] = in_stack_fffffffffffff238;
          b[3]._0_4_ = in_stack_fffffffffffff250;
          b[3]._4_4_ = in_stack_fffffffffffff254;
          local_280 = local_a80;
          auStack_270 = auStack_a70;
          _mm256_min_epi64_rpl(a,b);
        }
        for (local_9d0 = 0; local_9d0 < local_9bc; local_9d0 = local_9d0 + 1) {
          local_1c8 = local_a20 + (long)(local_9f0 + -1) * 4;
          auVar36 = vpermq_avx2(*(undefined1 (*) [32])local_1c8,0x90);
          auVar36 = vpblendd_avx2(auVar36,ZEXT1632(ZEXT816(0) << 0x40),3);
          local_d20 = vpblendd_avx2(auVar36,ZEXT832((ulong)local_a10[local_9d0]),3);
          lVar26 = local_a00 +
                   (long)(*(int *)(*(long *)(local_9e8 + 0x10) +
                                  (ulong)*(byte *)(local_9b8 + local_9d0) * 4) * local_9f0) * 0x20;
          local_2c0 = (*local_a28)[0];
          lStack_2b8 = (*local_a28)[1];
          lStack_2b0 = (*local_a28)[2];
          lStack_2a8 = (*local_a28)[3];
          local_2a0 = local_b00;
          uStack_298 = uStack_af8;
          uStack_290 = uStack_af0;
          uStack_288 = uStack_ae8;
          auVar14._8_8_ = uStack_af8;
          auVar14._0_8_ = local_b00;
          auVar14._16_8_ = uStack_af0;
          auVar14._24_8_ = uStack_ae8;
          local_cc0 = vpsubq_avx2(auVar14,(undefined1  [32])*local_a28);
          local_ce0._8_8_ = uStack_af8;
          local_ce0._0_8_ = local_b00;
          local_ce0._16_8_ = uStack_af0;
          local_ce0._24_8_ = uStack_ae8;
          local_9cc = 0;
          while( true ) {
            if (local_9f0 <= local_9cc) break;
            local_1d0 = local_a20 + (long)local_9cc * 4;
            local_320 = *local_1d0;
            lStack_318 = local_1d0[1];
            lStack_310 = local_1d0[2];
            lStack_308 = local_1d0[3];
            auVar16 = *(undefined1 (*) [32])local_1d0;
            local_1d8 = local_a08 + local_9cc;
            auVar24 = *(undefined1 (*) [24])*local_1d8;
            lStack_2c8 = (*local_1d8)[3];
            local_1e0 = (undefined1 (*) [32])(lVar26 + (long)local_9cc * 0x20);
            uVar2 = *(undefined8 *)*local_1e0;
            uVar3 = *(undefined8 *)(*local_1e0 + 8);
            uVar4 = *(undefined8 *)(*local_1e0 + 0x10);
            uVar5 = *(undefined8 *)(*local_1e0 + 0x18);
            auVar7 = *local_1e0;
            local_ca0 = auVar24._0_8_;
            lStack_c98 = auVar24._8_8_;
            lStack_c90 = auVar24._16_8_;
            local_2e0 = local_ca0;
            uStack_2d8 = lStack_c98;
            uStack_2d0 = lStack_c90;
            auVar13._16_8_ = auStack_a70._0_8_;
            auVar13._0_16_ = local_a80;
            auVar13._24_8_ = auStack_a70._8_8_;
            auVar36 = vpsubq_avx2((undefined1  [32])*local_1d8,auVar13);
            local_340 = local_a60;
            uStack_338 = uStack_a58;
            uStack_330 = uStack_a50;
            uStack_328 = uStack_a48;
            auVar12._8_8_ = uStack_a58;
            auVar12._0_8_ = local_a60;
            auVar12._16_8_ = uStack_a50;
            auVar12._24_8_ = uStack_a48;
            vpsubq_avx2(*(undefined1 (*) [32])local_1d0,auVar12);
            a_00[1] = in_stack_fffffffffffff260;
            a_00[0] = in_stack_fffffffffffff258;
            a_00[2] = in_stack_fffffffffffff268;
            a_00[3] = in_stack_fffffffffffff270;
            b_00[1] = in_stack_fffffffffffff240._0_8_;
            b_00[2] = in_stack_fffffffffffff240._8_8_;
            b_00[0] = in_stack_fffffffffffff238;
            b_00[3]._0_4_ = in_stack_fffffffffffff250;
            b_00[3]._4_4_ = in_stack_fffffffffffff254;
            local_300 = local_a80;
            auStack_2f0 = auStack_a70;
            _mm256_max_epi64_rpl(a_00,b_00);
            local_5a0 = local_d20._0_8_;
            uStack_598 = local_d20._8_8_;
            uStack_590 = local_d20._16_8_;
            uStack_588 = local_d20._24_8_;
            vpaddq_avx2(local_d20,auVar7);
            palVar28 = local_a28 + local_9cc;
            local_600 = (*palVar28)[0];
            lStack_5f8 = (*palVar28)[1];
            lStack_5f0 = (*palVar28)[2];
            lStack_5e8 = (*palVar28)[3];
            local_5e0 = local_cc0._0_8_;
            uStack_5d8 = local_cc0._8_8_;
            uStack_5d0 = local_cc0._16_8_;
            uStack_5c8 = local_cc0._24_8_;
            vpaddq_avx2(local_cc0,(undefined1  [32])*palVar28);
            a_01[1] = in_stack_fffffffffffff260;
            a_01[0] = in_stack_fffffffffffff258;
            a_01[2] = in_stack_fffffffffffff268;
            a_01[3] = in_stack_fffffffffffff270;
            b_01[1] = in_stack_fffffffffffff240._0_8_;
            b_01[2] = in_stack_fffffffffffff240._8_8_;
            b_01[0] = in_stack_fffffffffffff238;
            b_01[3]._0_4_ = in_stack_fffffffffffff250;
            b_01[3]._4_4_ = in_stack_fffffffffffff254;
            local_5c0 = uVar2;
            uStack_5b8 = uVar3;
            uStack_5b0 = uVar4;
            uStack_5a8 = uVar5;
            _mm256_max_epi64_rpl(a_01,b_01);
            local_ca0 = auVar36._0_8_;
            lStack_c98 = auVar36._8_8_;
            lStack_c90 = auVar36._16_8_;
            lStack_c88 = auVar36._24_8_;
            a_02[1] = in_stack_fffffffffffff260;
            a_02[0] = in_stack_fffffffffffff258;
            a_02[2] = in_stack_fffffffffffff268;
            a_02[3] = in_stack_fffffffffffff270;
            b_02[1] = in_stack_fffffffffffff240._0_8_;
            b_02[2] = in_stack_fffffffffffff240._8_8_;
            b_02[0] = in_stack_fffffffffffff238;
            b_02[3]._0_4_ = in_stack_fffffffffffff250;
            b_02[3]._4_4_ = in_stack_fffffffffffff254;
            local_cc0._0_8_ = local_ca0;
            local_cc0._8_8_ = lStack_c98;
            local_cc0._16_8_ = lStack_c90;
            local_cc0._24_8_ = lStack_c88;
            _mm256_max_epi64_rpl(a_02,b_02);
            local_488 = local_a08 + local_9cc;
            local_4c0 = local_ca0;
            lStack_4b8 = lStack_c98;
            lStack_4b0 = lStack_c90;
            lStack_4a8 = lStack_c88;
            (*local_488)[0] = local_ca0;
            (*local_488)[1] = lStack_c98;
            (*local_488)[2] = lStack_c90;
            (*local_488)[3] = lStack_c88;
            local_4c8 = local_a18 + local_9cc;
            (*local_4c8)[0] = local_cc0._0_8_;
            (*local_4c8)[1] = local_cc0._8_8_;
            (*local_4c8)[2] = local_cc0._16_8_;
            (*local_4c8)[3] = local_cc0._24_8_;
            local_9cc = local_9cc + 1;
            local_d20 = auVar16;
            local_500 = local_cc0._0_8_;
            lStack_4f8 = local_cc0._8_8_;
            lStack_4f0 = local_cc0._16_8_;
            lStack_4e8 = local_cc0._24_8_;
          }
          auVar36 = vpermq_avx2(local_cc0,0x90);
          auVar36 = vpblendd_avx2(auVar36,ZEXT1632(ZEXT816(0) << 0x40),3);
          auVar36 = vpblendd_avx2(auVar36,ZEXT832((ulong)local_a10[(long)local_9d0 + 1]),3);
          local_cc0._0_8_ = auVar36._0_8_;
          local_cc0._8_8_ = auVar36._8_8_;
          local_cc0._16_8_ = auVar36._16_8_;
          local_cc0._24_8_ = auVar36._24_8_;
          local_640 = (*local_a28)[0];
          lStack_638 = (*local_a28)[1];
          lStack_630 = (*local_a28)[2];
          lStack_628 = (*local_a28)[3];
          local_620 = local_cc0._0_8_;
          uStack_618 = local_cc0._8_8_;
          uStack_610 = local_cc0._16_8_;
          uStack_608 = local_cc0._24_8_;
          vpaddq_avx2(auVar36,(undefined1  [32])*local_a28);
          a_03[1] = in_stack_fffffffffffff260;
          a_03[0] = in_stack_fffffffffffff258;
          a_03[2] = in_stack_fffffffffffff268;
          a_03[3] = in_stack_fffffffffffff270;
          b_03[1] = in_stack_fffffffffffff240._0_8_;
          b_03[2] = in_stack_fffffffffffff240._8_8_;
          b_03[0] = in_stack_fffffffffffff238;
          b_03[3]._0_4_ = in_stack_fffffffffffff250;
          b_03[3]._4_4_ = in_stack_fffffffffffff254;
          _mm256_max_epi64_rpl(a_03,b_03);
          for (local_9cc = 0; local_9cc < local_9ec + -2; local_9cc = local_9cc + 1) {
            auVar36 = vpermq_avx2(local_ce0,0x90);
            auVar36 = vpblendd_avx2(auVar36,ZEXT832(0),3);
            local_d80 = auVar36._0_8_;
            uStack_d78 = auVar36._8_8_;
            uStack_d70 = auVar36._16_8_;
            uStack_d68 = auVar36._24_8_;
            local_660 = local_d80;
            uStack_658 = uStack_d78;
            uStack_650 = uStack_d70;
            uStack_648 = uStack_d68;
            local_680 = local_be0._0_8_;
            uStack_678 = local_be0._8_8_;
            uStack_670 = local_be0._16_8_;
            uStack_668 = local_be0._24_8_;
            vpaddq_avx2(auVar36,local_be0);
            a_04[1] = in_stack_fffffffffffff260;
            a_04[0] = in_stack_fffffffffffff258;
            a_04[2] = in_stack_fffffffffffff268;
            a_04[3] = in_stack_fffffffffffff270;
            b_04[1] = in_stack_fffffffffffff240._0_8_;
            b_04[2] = in_stack_fffffffffffff240._8_8_;
            b_04[0] = in_stack_fffffffffffff238;
            b_04[3]._0_4_ = in_stack_fffffffffffff250;
            b_04[3]._4_4_ = in_stack_fffffffffffff254;
            _mm256_max_epi64_rpl(a_04,b_04);
          }
          auVar36 = vpermq_avx2(local_ce0,0x90);
          auVar36 = vpblendd_avx2(auVar36,ZEXT832(0),3);
          local_ce0._0_8_ = auVar36._0_8_;
          local_ce0._8_8_ = auVar36._8_8_;
          local_ce0._16_8_ = auVar36._16_8_;
          local_ce0._24_8_ = auVar36._24_8_;
          local_6a0 = local_ce0._0_8_;
          uStack_698 = local_ce0._8_8_;
          uStack_690 = local_ce0._16_8_;
          uStack_688 = local_ce0._24_8_;
          local_6c0 = local_bc0;
          uStack_6b8 = uStack_bb8;
          uStack_6b0 = uStack_bb0;
          uStack_6a8 = uStack_ba8;
          auVar8._8_8_ = uStack_bb8;
          auVar8._0_8_ = local_bc0;
          auVar8._16_8_ = uStack_bb0;
          auVar8._24_8_ = uStack_ba8;
          local_ce0 = vpaddq_avx2(auVar36,auVar8);
          a_05[1] = in_stack_fffffffffffff260;
          a_05[0] = in_stack_fffffffffffff258;
          a_05[2] = in_stack_fffffffffffff268;
          a_05[3] = in_stack_fffffffffffff270;
          b_05[1] = in_stack_fffffffffffff240._0_8_;
          b_05[2] = in_stack_fffffffffffff240._8_8_;
          b_05[0] = in_stack_fffffffffffff238;
          b_05[3]._0_4_ = in_stack_fffffffffffff250;
          b_05[3]._4_4_ = in_stack_fffffffffffff254;
          _mm256_max_epi64_rpl(a_05,b_05);
          local_9cc = 0;
          local_d00 = local_cc0._0_8_;
          uStack_cf8 = local_cc0._8_8_;
          uStack_cf0 = local_cc0._16_8_;
          uStack_ce8 = local_cc0._24_8_;
          while( true ) {
            if (local_9f0 <= local_9cc) break;
            local_1e8 = local_a18 + local_9cc;
            auVar24 = *(undefined1 (*) [24])*local_1e8;
            uVar27 = (*local_1e8)[3];
            local_360 = local_ce0._0_8_;
            uStack_358 = local_ce0._8_8_;
            uStack_350 = local_ce0._16_8_;
            uStack_348 = local_ce0._24_8_;
            auVar11._16_8_ = auStack_a70._0_8_;
            auVar11._0_16_ = local_a80;
            auVar11._24_8_ = auStack_a70._8_8_;
            local_ce0 = vpsubq_avx2(local_ce0,auVar11);
            local_3a0 = local_d00;
            uStack_398 = uStack_cf8;
            uStack_390 = uStack_cf0;
            uStack_388 = uStack_ce8;
            local_3c0 = local_a60;
            uStack_3b8 = uStack_a58;
            uStack_3b0 = uStack_a50;
            uStack_3a8 = uStack_a48;
            auVar10._8_8_ = uStack_cf8;
            auVar10._0_8_ = local_d00;
            auVar10._16_8_ = uStack_cf0;
            auVar10._24_8_ = uStack_ce8;
            auVar9._8_8_ = uStack_a58;
            auVar9._0_8_ = local_a60;
            auVar9._16_8_ = uStack_a50;
            auVar9._24_8_ = uStack_a48;
            vpsubq_avx2(auVar10,auVar9);
            a_06[1] = in_stack_fffffffffffff260;
            a_06[0] = in_stack_fffffffffffff258;
            a_06[2] = in_stack_fffffffffffff268;
            a_06[3] = in_stack_fffffffffffff270;
            b_06[1] = in_stack_fffffffffffff240._0_8_;
            b_06[2] = in_stack_fffffffffffff240._8_8_;
            b_06[0] = in_stack_fffffffffffff238;
            b_06[3]._0_4_ = in_stack_fffffffffffff250;
            b_06[3]._4_4_ = in_stack_fffffffffffff254;
            local_380 = local_a80;
            auStack_370 = auStack_a70;
            _mm256_max_epi64_rpl(a_06,b_06);
            local_cc0._0_8_ = auVar24._0_8_;
            local_cc0._8_8_ = auVar24._8_8_;
            local_cc0._16_8_ = auVar24._16_8_;
            a_07[1] = in_stack_fffffffffffff260;
            a_07[0] = in_stack_fffffffffffff258;
            a_07[2] = in_stack_fffffffffffff268;
            a_07[3] = in_stack_fffffffffffff270;
            b_07[1] = in_stack_fffffffffffff240._0_8_;
            b_07[2] = in_stack_fffffffffffff240._8_8_;
            b_07[0] = in_stack_fffffffffffff238;
            b_07[3]._0_4_ = in_stack_fffffffffffff250;
            b_07[3]._4_4_ = in_stack_fffffffffffff254;
            _mm256_max_epi64_rpl(a_07,b_07);
            local_508 = local_a20 + (long)local_9cc * 4;
            *local_508 = local_cc0._0_8_;
            local_508[1] = local_cc0._8_8_;
            local_508[2] = local_cc0._16_8_;
            local_508[3] = uVar27;
            a_08[1] = in_stack_fffffffffffff260;
            a_08[0] = in_stack_fffffffffffff258;
            a_08[2] = in_stack_fffffffffffff268;
            a_08[3] = in_stack_fffffffffffff270;
            b_08[1] = in_stack_fffffffffffff240._0_8_;
            b_08[2] = in_stack_fffffffffffff240._8_8_;
            b_08[0] = in_stack_fffffffffffff238;
            b_08[3]._0_4_ = in_stack_fffffffffffff250;
            b_08[3]._4_4_ = in_stack_fffffffffffff254;
            local_540 = local_cc0._0_8_;
            uStack_538 = local_cc0._8_8_;
            uStack_530 = local_cc0._16_8_;
            uStack_528 = uVar27;
            _mm256_min_epi64_rpl(a_08,b_08);
            a_09[1] = in_stack_fffffffffffff260;
            a_09[0] = in_stack_fffffffffffff258;
            a_09[2] = in_stack_fffffffffffff268;
            a_09[3] = in_stack_fffffffffffff270;
            b_09[1] = in_stack_fffffffffffff240._0_8_;
            b_09[2] = in_stack_fffffffffffff240._8_8_;
            b_09[0] = in_stack_fffffffffffff238;
            b_09[3]._0_4_ = in_stack_fffffffffffff250;
            b_09[3]._4_4_ = in_stack_fffffffffffff254;
            _mm256_min_epi64_rpl(a_09,b_09);
            a_10[1] = in_stack_fffffffffffff260;
            a_10[0] = in_stack_fffffffffffff258;
            a_10[2] = in_stack_fffffffffffff268;
            a_10[3] = in_stack_fffffffffffff270;
            b_10[1] = in_stack_fffffffffffff240._0_8_;
            b_10[2] = in_stack_fffffffffffff240._8_8_;
            b_10[0] = in_stack_fffffffffffff238;
            b_10[3]._0_4_ = in_stack_fffffffffffff250;
            b_10[3]._4_4_ = in_stack_fffffffffffff254;
            _mm256_max_epi64_rpl(a_10,b_10);
            vH_00[0]._4_4_ = in_stack_fffffffffffff1fc;
            vH_00[0]._0_4_ = in_stack_fffffffffffff1f8;
            vH_00[1] = in_stack_fffffffffffff200;
            vH_00[2] = in_stack_fffffffffffff208;
            vH_00[3]._0_4_ = in_stack_fffffffffffff210;
            vH_00[3]._4_4_ = in_stack_fffffffffffff214;
            arr_store_si256(in_stack_fffffffffffff220,vH_00,
                            (int32_t)((ulong)in_stack_fffffffffffff1f0 >> 0x20),
                            (int32_t)in_stack_fffffffffffff1f0,in_stack_fffffffffffff1ec,
                            in_stack_fffffffffffff1e8);
            local_9cc = local_9cc + 1;
            local_d00 = local_cc0._0_8_;
            uStack_cf8 = local_cc0._8_8_;
            uStack_cf0 = local_cc0._16_8_;
            uStack_ce8 = uVar27;
          }
          local_1f0 = local_a20 + (long)local_9f4 * 4;
          lVar26 = *local_1f0;
          lVar37 = local_1f0[1];
          lVar38 = local_1f0[2];
          lVar39 = local_1f0[3];
          local_100 = local_b80._0_8_;
          uStack_f8 = local_b80._8_8_;
          uStack_f0 = local_b80._16_8_;
          uStack_e8 = local_b80._24_8_;
          local_1c0 = vpcmpgtq_avx2(*(undefined1 (*) [32])local_1f0,local_b80);
          local_1a0 = local_ba0;
          lStack_198 = lStack_b98;
          lStack_190 = lStack_b90;
          lStack_188 = lStack_b88;
          auVar18._8_8_ = lStack_b98;
          auVar18._0_8_ = local_ba0;
          auVar18._16_8_ = lStack_b90;
          auVar18._24_8_ = lStack_b88;
          auVar36 = vpand_avx2(auVar18,local_1c0);
          in_stack_fffffffffffff260 = auVar36._0_8_;
          in_stack_fffffffffffff268 = auVar36._8_8_;
          in_stack_fffffffffffff270 = auVar36._16_8_;
          uStack_d88 = auVar36._24_8_;
          a_11[1] = in_stack_fffffffffffff260;
          a_11[0] = in_stack_fffffffffffff258;
          a_11[2] = in_stack_fffffffffffff268;
          a_11[3] = in_stack_fffffffffffff270;
          b_11[1] = in_stack_fffffffffffff240._0_8_;
          b_11[2] = in_stack_fffffffffffff240._8_8_;
          b_11[0] = in_stack_fffffffffffff238;
          b_11[3]._0_4_ = in_stack_fffffffffffff250;
          b_11[3]._4_4_ = in_stack_fffffffffffff254;
          local_e0 = lVar26;
          lStack_d8 = lVar37;
          lStack_d0 = lVar38;
          lStack_c8 = lVar39;
          _mm256_max_epi64_rpl(a_11,b_11);
          local_b80._8_8_ = lVar37;
          local_b80._0_8_ = lVar26;
          local_b80._16_8_ = lVar38;
          local_b80._24_8_ = lVar39;
          uStack_88 = uStack_d88;
          auVar23._8_8_ = in_stack_fffffffffffff268;
          auVar23._0_8_ = in_stack_fffffffffffff260;
          auVar23._16_8_ = in_stack_fffffffffffff270;
          auVar23._24_8_ = uStack_d88;
          if ((((((((((((((((((((((((((((((((auVar23 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar23 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar23 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar23 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar23 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar23 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar23 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar23 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar23 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar23 >> 0x4f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar23 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar23 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar23 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar23 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar23 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar23 >> 0x7f,0) != '\0') ||
                            (auVar23 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar23 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar23 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar23 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar23 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar23 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar23 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar23 >> 0xbf,0) != '\0') || (uStack_d88 >> 7 & 1) != 0) ||
                   (uStack_d88 >> 0xf & 1) != 0) || (uStack_d88 >> 0x17 & 1) != 0) ||
                 (uStack_d88 >> 0x1f & 1) != 0) || (uStack_d88 >> 0x27 & 1) != 0) ||
               (uStack_d88 >> 0x2f & 1) != 0) || (uStack_d88 >> 0x37 & 1) != 0) ||
              (long)uStack_d88 < 0) {
            local_9dc = local_9d0;
          }
          local_a0 = in_stack_fffffffffffff260;
          uStack_98 = in_stack_fffffffffffff268;
          lStack_90 = in_stack_fffffffffffff270;
        }
        if (s2_beg != 0) {
          for (local_9d4 = 0; local_9d4 < local_9f8; local_9d4 = local_9d4 + 1) {
            auVar36 = vpermq_avx2(local_b80,0x90);
            local_b80 = vpblendd_avx2(auVar36,ZEXT1632(ZEXT816(0) << 0x40),3);
          }
          local_ac8 = local_b80._24_8_;
          local_9d8 = local_9e0 + -1;
        }
        if (in_stack_00000008 != 0) {
          plVar65 = local_a20;
          for (local_9cc = 0; local_9cc < local_9f0 * local_9ec; local_9cc = local_9cc + 1) {
            iVar25 = local_9cc / local_9ec + (local_9cc % local_9ec) * local_9f0;
            if (iVar25 < local_9e0) {
              if ((long)local_ac8 < *plVar65) {
                local_ac8 = *plVar65;
                local_9dc = local_9bc + -1;
                local_9d8 = iVar25;
              }
              else if (((*plVar65 == local_ac8) && (local_9dc == local_9bc + -1)) &&
                      (iVar25 < local_9d8)) {
                local_9d8 = iVar25;
              }
            }
            plVar65 = plVar65 + 1;
          }
        }
        if ((in_stack_00000008 == 0) && (s2_beg == 0)) {
          local_1f8 = local_a20 + (long)local_9f4 * 4;
          uVar27 = *local_1f8;
          uStack_dd8 = local_1f8[1];
          uStack_dd0 = local_1f8[2];
          local_ac8 = local_1f8[3];
          for (local_9d4 = 0; local_9d4 < local_9f8; local_9d4 = local_9d4 + 1) {
            auVar6._8_8_ = uStack_dd8;
            auVar6._0_8_ = uVar27;
            auVar6._16_8_ = uStack_dd0;
            auVar6._24_8_ = local_ac8;
            auVar36 = vpermq_avx2(auVar6,0x90);
            auVar36 = vpblendd_avx2(auVar36,ZEXT1632(ZEXT816(0) << 0x40),3);
            uVar27 = auVar36._0_8_;
            uStack_dd8 = auVar36._8_8_;
            uStack_dd0 = auVar36._16_8_;
            local_ac8 = auVar36._24_8_;
          }
          local_9dc = local_9bc + -1;
          local_9d8 = local_9e0 + -1;
        }
        local_120 = local_b00;
        uStack_118 = uStack_af8;
        uStack_110 = uStack_af0;
        uStack_108 = uStack_ae8;
        local_140 = local_b40;
        uStack_138 = uStack_b38;
        uStack_130 = uStack_b30;
        uStack_128 = uStack_b28;
        auVar22._8_8_ = uStack_af8;
        auVar22._0_8_ = local_b00;
        auVar22._16_8_ = uStack_af0;
        auVar22._24_8_ = uStack_ae8;
        auVar21._8_8_ = uStack_b38;
        auVar21._0_8_ = local_b40;
        auVar21._16_8_ = uStack_b30;
        auVar21._24_8_ = uStack_b28;
        local_60 = vpcmpgtq_avx2(auVar22,auVar21);
        local_160 = local_b60;
        uStack_158 = uStack_b58;
        uStack_150 = uStack_b50;
        uStack_148 = uStack_b48;
        local_180 = local_b20;
        uStack_178 = uStack_b18;
        uStack_170 = uStack_b10;
        uStack_168 = uStack_b08;
        auVar20._8_8_ = uStack_b58;
        auVar20._0_8_ = local_b60;
        auVar20._16_8_ = uStack_b50;
        auVar20._24_8_ = uStack_b48;
        auVar19._8_8_ = uStack_b18;
        auVar19._0_8_ = local_b20;
        auVar19._16_8_ = uStack_b10;
        auVar19._24_8_ = uStack_b08;
        local_80 = vpcmpgtq_avx2(auVar20,auVar19);
        local_c0 = vpor_avx2(local_60,local_80);
        if ((((((((((((((((((((((((((((((((local_c0 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_c0 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_c0 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_c0 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_c0 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_c0 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_c0 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_c0 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_c0 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_c0 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (local_c0 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                               (local_c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (local_c0 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                              ) || (local_c0 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                            (local_c0 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(local_c0 >> 0x7f,0) != '\0') ||
                          (local_c0 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_c0 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_c0 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_c0 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_c0 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_c0 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_c0 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_c0 >> 0xbf,0) != '\0') ||
                  (local_c0 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_c0 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_c0 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_c0 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_c0 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_c0 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_c0 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_c0[0x1f] < '\0') {
          local_be8->flag = local_be8->flag | 0x40;
          local_ac8 = 0;
          local_9d8 = 0;
          local_9dc = 0;
        }
        local_be8->score = (int)local_ac8;
        local_be8->end_query = local_9d8;
        local_be8->end_ref = local_9dc;
        parasail_free(local_a28);
        parasail_free(local_a20);
        parasail_free(local_a18);
        parasail_free(local_a10);
        parasail_free(local_a08);
        local_9a8 = local_be8;
      }
    }
  }
  return local_9a8;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vE, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vHp = _mm256_add_epi64(vHp, vW);
            vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[i]));
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vF, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vH = _mm256_max_epi64_rpl(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m256i vCompare;
            vH = _mm256_load_si256(pvH + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi64(vH, vMaxH));
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}